

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver3L1Q<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *this;
  float *this_00;
  float *this_01;
  float *this_02;
  float *this_03;
  float *this_04;
  float *this_05;
  float *this_06;
  float *this_07;
  float *this_08;
  float *this_09;
  float *this_10;
  float *this_11;
  float *this_12;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  size_type sVar35;
  ostream *this_13;
  reference pvVar36;
  reference pvVar37;
  Scalar *pSVar38;
  reference pvVar39;
  Scalar *pSVar40;
  CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *pCVar41;
  DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *this_14;
  reference pvVar42;
  long lVar43;
  Index IVar44;
  Scalar *pSVar45;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pCVar46;
  Scalar SVar47;
  Product<Eigen::Matrix<float,_9,_6,_0,_9,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> PVar48;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  PVar49;
  XprTypeNested local_1bd8;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1bd0;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1bc0;
  value_type local_1ba8;
  Type local_1b60;
  non_const_type local_1b28;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_1b20;
  RowXpr local_1af8;
  Product<Eigen::Matrix<float,_9,_6,_0,_9,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_1ac0;
  Scalar local_1aac;
  CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> local_1aa8;
  int local_1a88;
  RealScalar local_1a84;
  int i;
  float a;
  undefined1 local_1a78 [8];
  Matrix<float,__1,__1,_0,__1,__1> P;
  Matrix<float,_6,_1,_0,_6,_1> b_sol;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,__1,_1,_0,__1,_1> b5;
  Matrix<float,__1,_1,_0,__1,_1> b4;
  Matrix<float,__1,_1,_0,__1,_1> b3;
  Matrix<float,__1,_1,_0,__1,_1> b2;
  Matrix<float,__1,_1,_0,__1,_1> b1;
  undefined1 local_19a0 [8];
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  b;
  Matrix<float,9,6,0,9,6> local_1950 [8];
  Matrix<float,_9,_6,_0,_9,_6> B;
  undefined1 local_1860 [8];
  BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> svd;
  float local_1760;
  float local_175c;
  float local_1758;
  float local_1754;
  float local_1750;
  float local_174c;
  float local_1748;
  float local_1744;
  float local_1740;
  float local_173c;
  float local_1738;
  float local_1734;
  float local_1730;
  float local_172c;
  float local_1728;
  float local_1724;
  float local_1720;
  float local_171c;
  float local_1718;
  float local_1714;
  float local_1710;
  float local_170c;
  float local_1708;
  float local_1704;
  float local_1700;
  float local_16fc;
  CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> local_16f8;
  undefined1 local_16d4 [8];
  Matrix<float,_3,_9,_0,_3,_9> A;
  float m36;
  float m35;
  float m34;
  float m33;
  float m32;
  float m31;
  float m26;
  float m25;
  float m24;
  float m23;
  float m22;
  float m21;
  float m16;
  float m15;
  float m14;
  float m13;
  float m12;
  float m11;
  float l36;
  float l35;
  float l34;
  float l33;
  float l32;
  float l31;
  float l26;
  float l25;
  float l24;
  float l23;
  float l22;
  float l21;
  float l16;
  float l15;
  float l14;
  float l13;
  float l12;
  float l11;
  RhsNested local_15d0;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_15c8;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_15b8;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_15a8;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_1598;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_1588;
  undefined1 local_1578 [8];
  Matrix<float,_6,_1,_0,_6,_1> M3_1;
  Matrix<float,_6,_1,_0,_6,_1> M2_1;
  Matrix<float,_6,_1,_0,_6,_1> M1_1;
  Matrix<float,_6,_1,_0,_6,_1> L3_1;
  Matrix<float,_6,_1,_0,_6,_1> L2_1;
  Matrix<float,_6,_1,_0,_6,_1> L1_1;
  Type local_14b0;
  ColXpr local_1478;
  Type local_1448;
  Matrix<float,_3,_1,_0,_3,_1> local_13e4;
  Matrix<float,_3,_3,_0,_3,_3> local_13d8;
  int local_13b4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_13b0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1390;
  Type local_1338;
  Type local_1300;
  Type local_12c8;
  Type local_1290;
  Type local_1258;
  Type local_1220;
  ColXpr local_11e8;
  Type local_11b8;
  Matrix<float,_3,_1,_0,_3,_1> local_1154;
  Matrix<float,_3,_3,_0,_3,_3> local_1148;
  int local_1124;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  local_1120;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1100;
  Type local_10a8;
  Type local_1070;
  Type local_1038;
  Type local_1000;
  undefined1 local_fc8 [8];
  Matrix<float,_6,_6,_0,_6,_6> transLineV;
  Matrix<float,_6,_6,_0,_6,_6> transLineU;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_4,_1,_0,_4,_1> local_e18;
  undefined1 local_e00 [8];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_dac;
  Type local_da8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_d6c [12];
  Type local_d60;
  undefined1 local_d28 [8];
  Matrix<float,_6,_1,_0,_6,_1> M3;
  Type local_cf8;
  RealScalar local_cbc;
  Type local_cb8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_c7c [12];
  Type local_c70;
  undefined1 local_c38 [8];
  Matrix<float,_6,_1,_0,_6,_1> M2;
  Type local_c08;
  RealScalar local_bcc;
  Type local_bc8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_b8c [12];
  Type local_b80;
  undefined1 local_b48 [8];
  Matrix<float,_6,_1,_0,_6,_1> M1;
  Type local_b18;
  RealScalar local_adc;
  Type local_ad8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_a9c [12];
  Type local_a90;
  undefined1 local_a58 [8];
  Matrix<float,_6,_1,_0,_6,_1> L3;
  Matrix<float,3,1,0,3,1> local_a24 [8];
  Matrix<float,_3,_1,_0,_3,_1> D3;
  RealScalar local_9dc;
  Type local_9d8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_99c [12];
  Type local_990;
  undefined1 local_958 [8];
  Matrix<float,_6,_1,_0,_6,_1> L2;
  Matrix<float,3,1,0,3,1> local_924 [8];
  Matrix<float,_3,_1,_0,_3,_1> D2;
  RealScalar local_8dc;
  Type local_8d8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_89c [12];
  Type local_890;
  undefined1 local_858 [8];
  Matrix<float,_6,_1,_0,_6,_1> L1;
  Matrix<float,3,1,0,3,1> local_824 [8];
  Matrix<float,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_7e0;
  Type local_790;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_758;
  Type local_708;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_6d0;
  Type local_680;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_648;
  Type local_5f8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_5c0;
  Type local_570;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_538;
  Type local_4e8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_4b0;
  Type local_460;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_428;
  Type local_3d8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_3a0;
  Type local_350;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_318;
  Type local_2c8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_290;
  Type local_240;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
  local_208;
  undefined1 local_1b8 [8];
  Matrix<float,_3,_1,_0,_3,_1> tQ32;
  Matrix<float,_3,_1,_0,_3,_1> tQ31;
  Matrix<float,_3,_1,_0,_3,_1> tQ22;
  Matrix<float,_3,_1,_0,_3,_1> tQ21;
  Matrix<float,_3,_1,_0,_3,_1> tQ12;
  Matrix<float,_3,_1,_0,_3,_1> tQ11;
  Matrix<float,_3,_1,_0,_3,_1> tP32;
  Matrix<float,_3,_1,_0,_3,_1> tP31;
  Matrix<float,_3,_1,_0,_3,_1> tP22;
  Matrix<float,_3,_1,_0,_3,_1> tP21;
  Matrix<float,_3,_1,_0,_3,_1> tP12;
  undefined1 local_128 [8];
  Matrix<float,_3,_1,_0,_3,_1> tP11;
  Matrix<float,_4,_1,_0,_4,_1> R32_B;
  Matrix<float,_4,_1,_0,_4,_1> R31_B;
  Matrix<float,_4,_1,_0,_4,_1> Q32;
  Matrix<float,_4,_1,_0,_4,_1> Q31;
  Matrix<float,_4,_1,_0,_4,_1> R22_B;
  Matrix<float,_4,_1,_0,_4,_1> R21_B;
  Matrix<float,_4,_1,_0,_4,_1> Q22;
  Matrix<float,_4,_1,_0,_4,_1> Q21;
  Matrix<float,_4,_1,_0,_4,_1> R12_B;
  Matrix<float,_4,_1,_0,_4,_1> R11_B;
  Matrix<float,_4,_1,_0,_4,_1> Q12;
  Matrix<float,_4,_1,_0,_4,_1> Q11;
  Matrix<float,_4,_1,_0,_4,_1> P1_B;
  Matrix<float,_4,_1,_0,_4,_1> P1;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar35 = std::
           vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
           ::size(ptPair);
  if (sVar35 != 0) {
    sVar35 = std::
             vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
             ::size(lPair);
    if (2 < sVar35) {
      this = P1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this);
      this_00 = Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_00);
      this_01 = Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_01);
      this_02 = R11_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_02);
      this_03 = R12_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_03);
      this_04 = Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_04);
      this_05 = Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_05);
      this_06 = R21_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_06);
      this_07 = R22_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_07);
      this_08 = Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_08);
      this_09 = Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_09);
      this_10 = R31_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_10);
      this_11 = R32_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_11);
      this_12 = tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2;
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)this_12);
      pvVar36 = std::
                vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                ::operator[](ptPair,0);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this,&pvVar36->first);
      pvVar36 = std::
                vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                ::operator[](ptPair,0);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_00,&pvVar36->second);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_01,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar37);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_02,&(pvVar37->first).second);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_03,&(pvVar37->second).first);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,0);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_04,&(pvVar37->second).second);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_05,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar37);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_06,&(pvVar37->first).second);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_07,&(pvVar37->second).first);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,1);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_08,&(pvVar37->second).second);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_09,(Matrix<float,_4,_1,_0,_4,_1> *)pvVar37);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_10,&(pvVar37->first).second);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_11,&(pvVar37->second).first);
      pvVar37 = std::
                vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                ::operator[](lPair,2);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                ((Matrix<float,_4,_1,_0,_4,_1> *)this_12,&(pvVar37->second).second);
      tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
      _3_1_ = 0;
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::vector(__return_storage_ptr__);
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_128);
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<float,_3,_1,_0,_3,_1> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_1b8);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_240,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_208,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_240,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)local_128,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_208);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_2c8,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (R11_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (R11_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_290,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_2c8,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_290);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_350,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (R12_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (R12_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_318,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_350,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_318);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_3d8,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_3a0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_3d8,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_3a0);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_460,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_428,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_460,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_428);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_4e8,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (R21_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (R21_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_4b0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_4e8,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_4b0);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_570,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (R22_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (R22_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_538,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_570,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_538);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_5f8,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_5c0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_5f8,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_5c0);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_680,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_648,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_680,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_648);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_708,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (R31_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (R31_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_6d0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_708,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_6d0);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                (&local_790,
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (R32_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (R32_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_758,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_790,
                 pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_758);
      Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
                ((Type *)(D1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                 (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                 (tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),3);
      pSVar38 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                           (tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array + 2),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_7e0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
                 (D1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),pSVar38);
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                ((Matrix<float,3,1,0,3,1> *)local_1b8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_7e0);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                  *)(L1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4),
                 (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_128);
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
                (local_824,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)(L1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_858);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_890,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_858,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_890,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_824);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                (local_89c,
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_8d8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_858,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_8d8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_89c);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(D2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                 (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_858,3);
      local_8dc = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)(D2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_858,&local_8dc);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                  *)(L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4),
                 (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
                (local_924,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)(L2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_958);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_990,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_958,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_990,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_924);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                (local_99c,
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_9d8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_958,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_9d8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_99c);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(D3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                 (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_958,3);
      local_9dc = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)(D3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_958,&local_9dc);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                  *)(L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4),
                 (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
                (local_a24,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)(L3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_a58);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_a90,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_a58,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_a90,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a24);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                (local_a9c,
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_ad8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_a58,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_ad8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a9c);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_b18,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_a58,3);
      local_adc = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)&local_b18);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_a58,&local_adc);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                  *)(M1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4),
                 (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                (local_824,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)(M1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_b48);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_b80,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_b48,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_b80,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_824);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                (local_b8c,
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_bc8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_b48,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_bc8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_b8c);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_c08,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_b48,3);
      local_bcc = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)&local_c08);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_b48,&local_bcc);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                  *)(M2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4),
                 (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1),
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                (local_924,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)(M2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_c38);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_c70,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_c38,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_c70,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_924);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                (local_c7c,
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_cb8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_c38,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_cb8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_c7c);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_cf8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_c38,3);
      local_cbc = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)&local_cf8);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_c38,&local_cbc);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                  *)(M3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4),(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_1b8,
                 (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 (tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 1));
      Eigen::Matrix<float,3,1,0,3,1>::operator=
                (local_a24,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)(M3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_d28);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                (&local_d60,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_d28,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_d60,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a24);
      Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
                (local_d6c,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_1b8);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_da8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_d28,3);
      Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false> *)&local_da8,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_d6c);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)&predTrans.
                          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_d28,3);
      local_dac = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)&predTrans.
                                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_d28,&local_dac);
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                (&local_e18,
                 (Matrix<float,_4,_1,_0,_4,_1> *)
                 (P1_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2));
      Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                ((Matrix<float,_4,_1,_0,_4,_1> *)
                 (TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),
                 (Matrix<float,_4,_1,_0,_4,_1> *)
                 (Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 2));
      getPredefinedTransformations3L1Q<float>
                ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *)local_e00,&local_e18,
                 (Matrix<float,_4,_1,_0,_4,_1> *)
                 (TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe));
      pvVar39 = std::
                vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        *)local_e00);
      Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<float,_4,_4,_0,_4,_4> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),pvVar39);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *)local_e00);
      pvVar39 = std::
                vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        *)local_e00);
      Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<float,_4,_4,_0,_4,_4> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),pvVar39);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *)local_e00);
      Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix
                ((Matrix<float,_6,_6,_0,_6,_6> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22));
      Eigen::Matrix<float,_6,_6,_0,_6,_6>::Matrix((Matrix<float,_6,_6,_0,_6,_6> *)local_fc8);
      Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
                ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22));
      Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::setZero
                ((DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_> *)local_fc8);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1000,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_1038,
                 (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1038,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_1000);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1070,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
                (&local_10a8,
                 (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_10a8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_1070);
      local_1124 = -1;
      Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col
                (&local_11e8,
                 (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                (&local_11b8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                 &local_11e8,3);
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
                ((Matrix<float,3,1,0,3,1> *)&local_1154,
                 (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                  *)&local_11b8);
      getSkew<float>(&local_1148,&local_1154);
      Eigen::operator*(&local_1120,&local_1124,(StorageBaseType *)&local_1148);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1220,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
      ::operator*(&local_1100,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                   *)&local_1120,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_1220);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
                (&local_1258,
                 (DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x22),3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1258,
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_1100);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1290,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_12c8,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fc8,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_12c8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_1290);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_1300,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,3);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
                (&local_1338,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fc8,3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_1338,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_1300);
      local_13b4 = -1;
      Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col
                (&local_1478,
                 (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                (&local_1448,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                 &local_1478,3);
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
                ((Matrix<float,3,1,0,3,1> *)&local_13e4,
                 (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                  *)&local_1448);
      getSkew<float>(&local_13d8,&local_13e4);
      Eigen::operator*(&local_13b0,&local_13b4,(StorageBaseType *)&local_13d8);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_14b0,
                 (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
      ::operator*(&local_1390,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>>
                   *)&local_13b0,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_14b0);
      Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>
                ((Type *)(L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array + 4),(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fc8,
                 3,3);
      Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
                 (L1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4),
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_1390);
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<float,_6,_1,_0,_6,_1> *)
                 (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<float,_6,_1,_0,_6,_1> *)
                 (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<float,_6,_1,_0,_6,_1> *)
                 (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<float,_6,_1,_0,_6,_1> *)
                 (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<float,_6,_1,_0,_6,_1> *)
                 (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix((Matrix<float,_6,_1,_0,_6,_1> *)local_1578);
      local_1588 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                               .m_data.array + 0x22),
                              (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_858);
      Eigen::Matrix<float,6,1,0,6,1>::operator=
                ((Matrix<float,6,1,0,6,1> *)
                 (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4),
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1588);
      local_1598 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                               .m_data.array + 0x22),
                              (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_958);
      Eigen::Matrix<float,6,1,0,6,1>::operator=
                ((Matrix<float,6,1,0,6,1> *)
                 (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4),
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1598);
      local_15a8 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage
                               .m_data.array + 0x22),
                              (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_a58);
      Eigen::Matrix<float,6,1,0,6,1>::operator=
                ((Matrix<float,6,1,0,6,1> *)
                 (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4),
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_15a8);
      local_15b8 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fc8,
                              (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_b48);
      Eigen::Matrix<float,6,1,0,6,1>::operator=
                ((Matrix<float,6,1,0,6,1> *)
                 (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4),
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_15b8);
      local_15c8 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fc8,
                              (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_c38);
      Eigen::Matrix<float,6,1,0,6,1>::operator=
                ((Matrix<float,6,1,0,6,1> *)
                 (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 4),
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_15c8);
      _l12 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_fc8,
                        (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_d28);
      Eigen::Matrix<float,6,1,0,6,1>::operator=
                ((Matrix<float,6,1,0,6,1> *)local_1578,
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                  *)&l12);
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),0);
      fVar1 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),1);
      fVar2 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),2);
      fVar3 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),3);
      fVar4 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),4);
      fVar5 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),5);
      fVar6 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),0);
      fVar7 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),1);
      fVar8 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),2);
      fVar9 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),3);
      fVar10 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),4);
      fVar11 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (L3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),5);
      fVar12 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),0);
      fVar13 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),1);
      fVar14 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),2);
      fVar15 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),3);
      fVar16 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),4);
      fVar17 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M1_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),5);
      fVar18 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),0);
      fVar19 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),1);
      fVar20 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),2);
      fVar21 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),3);
      fVar22 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),4);
      fVar23 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M2_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),5);
      fVar24 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),0);
      fVar25 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),1);
      fVar26 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),2);
      fVar27 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),3);
      fVar28 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),4);
      fVar29 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)
                           (M3_1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                            m_storage.m_data.array + 4),5);
      fVar30 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_1578,0);
      fVar31 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_1578,1);
      fVar32 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_1578,2);
      fVar33 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_1578,3);
      fVar34 = *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_1578,4);
      A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
           *pSVar40;
      pSVar40 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_1578,5);
      A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
           *pSVar40;
      Eigen::Matrix<float,_3,_9,_0,_3,_9>::Matrix((Matrix<float,_3,_9,_0,_3,_9> *)local_16d4);
      local_16fc = fVar1 * fVar22 + fVar4 * fVar19;
      Eigen::DenseBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator<<
                (&local_16f8,(DenseBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *)local_16d4,
                 &local_16fc);
      local_1700 = fVar2 * fVar22 + fVar5 * fVar19;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (&local_16f8,&local_1700);
      local_1704 = fVar3 * fVar22 + fVar6 * fVar19;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1704);
      local_1708 = fVar1 * fVar23 + fVar4 * fVar20;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1708);
      local_170c = fVar2 * fVar23 + fVar5 * fVar20;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_170c);
      local_1710 = fVar3 * fVar23 + fVar6 * fVar20;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1710);
      local_1714 = fVar1 * fVar24 + fVar4 * fVar21;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1714);
      local_1718 = fVar2 * fVar24 + fVar5 * fVar21;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1718);
      local_171c = fVar3 * fVar24 + fVar6 * fVar21;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_171c);
      local_1720 = fVar7 * fVar28 + fVar10 * fVar25;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1720);
      local_1724 = fVar8 * fVar28 + fVar11 * fVar25;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1724);
      local_1728 = fVar9 * fVar28 + fVar12 * fVar25;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1728);
      local_172c = fVar7 * fVar29 + fVar10 * fVar26;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_172c);
      local_1730 = fVar8 * fVar29 + fVar11 * fVar26;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1730);
      local_1734 = fVar9 * fVar29 + fVar12 * fVar26;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1734);
      local_1738 = fVar7 * fVar30 + fVar10 * fVar27;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1738);
      local_173c = fVar8 * fVar30 + fVar11 * fVar27;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_173c);
      local_1740 = fVar9 * fVar30 + fVar12 * fVar27;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1740);
      local_1744 = fVar13 * fVar34 + fVar16 * fVar31;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1744);
      local_1748 = fVar14 * fVar34 + fVar17 * fVar31;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1748);
      local_174c = fVar15 * fVar34 + fVar18 * fVar31;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_174c);
      local_1750 = fVar13 * A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.
                            m_data.array[0x1a] + fVar16 * fVar32;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1750);
      local_1754 = fVar14 * A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.
                            m_data.array[0x1a] + fVar17 * fVar32;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1754);
      local_1758 = fVar15 * A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.
                            m_data.array[0x1a] + fVar18 * fVar32;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1758);
      local_175c = fVar13 * A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.
                            m_data.array[0x19] + fVar16 * fVar33;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_175c);
      local_1760 = fVar14 * A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage.
                            m_data.array[0x19] + fVar17 * fVar33;
      pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                          (pCVar41,&local_1760);
      svd._244_4_ = fVar15 * A.super_PlainObjectBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>.m_storage
                             .m_data.array[0x19] + fVar18 * fVar33;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::operator_
                (pCVar41,(Scalar *)&svd.field_0xf4);
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_9,_0,_3,_9>_>::~CommaInitializer(&local_16f8);
      Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<float,3,9,0,3,9>>
                ((Matrix<float,_1,_1,0,_1,_1> *)
                 (B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                  array + 0x34),(EigenBase<Eigen::Matrix<float,_3,_9,_0,_3,_9>_> *)local_16d4);
      Eigen::BDCSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::BDCSVD
                ((BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_1860,
                 (MatrixType *)
                 (B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                  array + 0x34),0x14);
      Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<float,__1,__1,_0,__1,__1> *)
                 (B.super_PlainObjectBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_>.m_storage.m_data.
                  array + 0x34));
      this_14 = (DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)
                Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::matrixV
                          ((SVDBase<Eigen::BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
                           local_1860);
      Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topRightCorner<int,int>
                ((Type *)&b.
                          super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,this_14,9,6);
      Eigen::Matrix<float,9,6,0,9,6>::
      Matrix<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>
                (local_1950,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&b.
                     super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<float,9,6,0,9,6>>
                ((Matrix<float,_1,_1,0,_1,_1> *)
                 &b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (EigenBase<Eigen::Matrix<float,_9,_6,_0,_9,_6>_> *)local_1950);
      genposeandscale_solvecoeffs<float>
                ((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_19a0,
                 (Matrix<float,__1,__1,_0,__1,__1> *)
                 &b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<float,__1,__1,_0,__1,__1> *)
                 &b1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 (TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe));
      pvVar42 = std::
                vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                        *)local_19a0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 (TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe),pvVar42);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_19a0);
      pvVar42 = std::
                vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                        *)local_19a0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 pvVar42);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_19a0);
      pvVar42 = std::
                vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                        *)local_19a0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 pvVar42);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_19a0);
      pvVar42 = std::
                vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                        *)local_19a0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 pvVar42);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_19a0);
      pvVar42 = std::
                vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
                ::back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                        *)local_19a0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 pvVar42);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::pop_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_19a0);
      Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<float,_4,_4,_0,_4,_4> *)
                 (b_sol.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 4));
      Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<float,_6,_1,_0,_6,_1> *)
                 &P.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
                );
      a = 1.26117e-44;
      i = 1;
      Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,int>
                ((Matrix<float,_1,_1,0,_1,_1> *)local_1a78,(int *)&a,&i);
      local_1a88 = 0;
      while( true ) {
        lVar43 = (long)local_1a88;
        IVar44 = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                           ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                            &b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows);
        if (IVar44 <= lVar43) break;
        Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                   (b_sol.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 4),4,4);
        pSVar45 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)
                             &b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_1a88);
        Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator<<
                  (&local_1aa8,
                   (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                   &P.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols,pSVar45);
        pSVar45 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)
                             &b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_1a88);
        pCVar46 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                            (&local_1aa8,pSVar45);
        pSVar45 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)
                             &b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_1a88);
        pCVar46 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                            (pCVar46,pSVar45);
        pSVar45 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)
                             &b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_1a88);
        pCVar46 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                            (pCVar46,pSVar45);
        pSVar45 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)
                             (TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                              m_storage.m_data.array + 0xe),(long)local_1a88);
        pCVar46 = Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                            (pCVar46,pSVar45);
        local_1aac = 1.0;
        Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator_
                  (pCVar46,&local_1aac);
        Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::~CommaInitializer
                  (&local_1aa8);
        PVar48 = Eigen::MatrixBase<Eigen::Matrix<float,9,6,0,9,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<float,9,6,0,9,6>> *)local_1950,
                            (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
                            &P.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols);
        local_1ac0 = PVar48;
        Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
                  ((Matrix<float,_1,_1,0,_1,_1> *)local_1a78,
                   (DenseBase<Eigen::Product<Eigen::Matrix<float,_9,_6,_0,_9,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_1ac0);
        Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_1a78,3,3);
        Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_1af8,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_1a78,0);
        local_1a84 = Eigen::
                     MatrixBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                     ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                             *)&local_1af8);
        SVar47 = Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::determinant
                           ((MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_1a78);
        if (SVar47 < 0.0) {
          local_1a84 = -local_1a84;
        }
        Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator/
                  (&local_1b20,(MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_1a78,
                   &local_1a84);
        Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
                  ((Matrix<float,_1,_1,0,_1,_1> *)local_1a78,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_1b20);
        local_1b28 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                               ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_1a78);
        Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                  (&local_1b60,
                   (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                   (b_sol.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                    m_data.array + 4),3,3);
        Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_1b60,
                   (DenseBase<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
                   &local_1b28);
        local_1bd8 = (XprTypeNested)
                     Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                               ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                (TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array + 0xe));
        PVar49 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                           ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)
                            &local_1bd8,
                            (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                            (b_sol.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 4));
        local_1bd0 = PVar49;
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
        ::operator*(&local_1bc0,
                    (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                     *)&local_1bd0,
                    (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                    (transLineU.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array + 0x22));
        Eigen::Matrix<float,4,4,0,4,4>::
        Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                  ((Matrix<float,4,4,0,4,4> *)&local_1ba8,
                   (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                    *)&local_1bc0);
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::push_back(__return_storage_ptr__,&local_1ba8);
        local_1a88 = local_1a88 + 1;
      }
      tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
      _3_1_ = 1;
      Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<float,__1,__1,_0,__1,__1> *)local_1a78);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 (TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xe));
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)
                 &b2.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      ;
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                 *)local_19a0);
      Eigen::BDCSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~BDCSVD
                ((BDCSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_1860);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::~vector((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 *)local_e00);
      if ((tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1]._3_1_ & 1) == 0) {
        std::
        vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  }
  this_13 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 point, and 3 line pairs!");
  std::ostream::operator<<(this_13,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver3L1Q(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 point, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> P1, P1_B, Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, Q31, Q32, R31_B, R32_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;

	Q11 = lPair[0].first.first; Q12 = lPair[0].first.second;
	R11_B = lPair[0].second.first; R12_B = lPair[0].second.second;
	Q21 = lPair[1].first.first; Q22 = lPair[1].first.second;
	R21_B = lPair[1].second.first; R22_B = lPair[1].second.second;
	Q31 = lPair[2].first.first; Q32 = lPair[2].first.second;
	R31_B = lPair[2].second.first; R32_B = lPair[2].second.second;


	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP11, tP12, tP21, tP22, tP31, tP32, tQ11, tQ12, tQ21, tQ22, tQ31, tQ32;
	// points first lines
	tP11 = Q11.head(3) / Q11(3);
	tP12 = Q12.head(3) / Q12(3);
	tQ11 = R11_B.head(3) / R11_B(3);
	tQ12 = R12_B.head(3) / R12_B(3);
	// points second lines
	tP21 = Q21.head(3) / Q21(3);
	tP22 = Q22.head(3) / Q22(3);
	tQ21 = R21_B.head(3) / R21_B(3);
	tQ22 = R22_B.head(3) / R22_B(3);
	// points third lines
	tP31 = Q31.head(3) / Q31(3);
	tP32 = Q32.head(3) / Q32(3);
	tQ31 = R31_B.head(3) / R31_B(3);
	tQ32 = R32_B.head(3) / R32_B(3);

	// computing the plucker coordinates of the lines
	// ref A
	Matrix<floatPrec, 3,1> D1 = tP12 - tP11;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP12.cross(tP11);
	L1 /= L1.head(3).norm();
	Matrix<floatPrec, 3,1> D2 = tP22 - tP21;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tP22.cross(tP21);
	L2 /= L2.head(3).norm();
	Matrix<floatPrec, 3,1> D3 = tP32 - tP31;
	Matrix<floatPrec, 6,1> L3;
	L3.head(3) = D3;
	L3.tail(3) = tP32.cross(tP31);
	L3 /= L3.head(3).norm();
	// ref B
	D1 = tQ12 - tQ11;
	Matrix<floatPrec, 6,1> M1;
	M1.head(3) = D1;
	M1.tail(3) = tQ12.cross(tQ11);
	M1 /= M1.head(3).norm();
	D2 = tQ22 - tQ21;
	Matrix<floatPrec, 6,1> M2;
	M2.head(3) = D2;
	M2.tail(3) = tQ22.cross(tQ21);
	M2 /= M2.head(3).norm();
	D3 = tQ32 - tQ31;
	Matrix<floatPrec, 6,1> M3;
	M3.head(3) = D3;
	M3.tail(3) = tQ32.cross(tQ31);
	M3 /= M3.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations3L1Q(P1, P1_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_1, L2_1, L3_1, M1_1, M2_1, M3_1;
	L1_1 = transLineU * L1;
	L2_1 = transLineU * L2;
	L3_1 = transLineU * L3;
	M1_1 = transLineV * M1;
	M2_1 = transLineV * M2;
	M3_1 = transLineV * M3;

	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26, l31, l32, l33, l34, l35, l36;
	l11 = L1_1[0];
	l12 = L1_1[1];
	l13 = L1_1[2];
	l14 = L1_1[3];
	l15 = L1_1[4];
	l16 = L1_1[5];
	l21 = L2_1[0];
	l22 = L2_1[1];
	l23 = L2_1[2];
	l24 = L2_1[3];
	l25 = L2_1[4];
	l26 = L2_1[5];
	l31 = L3_1[0];
	l32 = L3_1[1];
	l33 = L3_1[2];
	l34 = L3_1[3];
	l35 = L3_1[4];
	l36 = L3_1[5];
	floatPrec m11, m12, m13, m14, m15, m16, m21, m22, m23, m24, m25, m26, m31, m32, m33, m34, m35, m36;
	m11 = M1_1[0];
	m12 = M1_1[1];
	m13 = M1_1[2];
	m14 = M1_1[3];
	m15 = M1_1[4];
	m16 = M1_1[5];
	m21 = M2_1[0];
	m22 = M2_1[1];
	m23 = M2_1[2];
	m24 = M2_1[3];
	m25 = M2_1[4];
	m26 = M2_1[5];
	m31 = M3_1[0];
	m32 = M3_1[1];
	m33 = M3_1[2];
	m34 = M3_1[3];
	m35 = M3_1[4];
	m36 = M3_1[5];

	Matrix<floatPrec, 3,9> A;
	A << l11 * m14 + l14 * m11, l12 * m14 + l15 * m11, l13 * m14 + l16 * m11, l11 * m15 + l14 * m12, l12 * m15 + l15 * m12, l13 * m15 + l16 * m12, l11 * m16 + l14 * m13, l12 * m16 + l15 * m13, l13 * m16 + l16 * m13,
		l21 * m24 + l24 * m21, l22 * m24 + l25 * m21, l23 * m24 + l26 * m21, l21 * m25 + l24 * m22, l22 * m25 + l25 * m22, l23 * m25 + l26 * m22, l21 * m26 + l24 * m23, l22 * m26 + l25 * m23, l23 * m26 + l26 * m23,
		l31 * m34 + l34 * m31, l32 * m34 + l35 * m31, l33 * m34 + l36 * m31, l31 * m35 + l34 * m32, l32 * m35 + l35 * m32, l33 * m35 + l36 * m32, l31 * m36 + l34 * m33, l32 * m36 + l35 * m33, l33 * m36 + l36 * m33;

	BDCSVD<Matrix<floatPrec, Dynamic,Dynamic>> svd(A, ComputeFullU | ComputeFullV);
	Matrix<floatPrec, 9,6> B = svd.matrixV().topRightCorner(9, 6);

	vector<Matrix<floatPrec, Dynamic,1>> b = genposeandscale_solvecoeffs<floatPrec>(B);

	Matrix<floatPrec, Dynamic,1> b1, b2, b3, b4, b5;
	b5 = b.back();
	b.pop_back();
	b4 = b.back();
	b.pop_back();
	b3 = b.back();
	b.pop_back();
	b2 = b.back();
	b.pop_back();
	b1 = b.back();
	b.pop_back();

	Matrix<floatPrec, 4,4> TP;
	Matrix<floatPrec, 6,1> b_sol;
	Matrix<floatPrec, Dynamic,Dynamic> P(9,1);
	floatPrec a;
	for (int i = 0; i < b1.size(); i++)
	{
		TP.setIdentity(4,4);

		b_sol << b1[i], b2[i], b3[i], b4[i], b5[i], 1;
		
		P = B * b_sol;

		P.resize(3, 3);
		a = P.row(0).norm();

		if (P.determinant() < 0)
		{
			a = -a;
		}

		P = P / a;

		TP.topLeftCorner(3, 3) = P.transpose();

		out.push_back(TV.inverse() * TP * TU);
	}

	return out;
}